

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.h
# Opt level: O0

void __thiscall
cxxopts::exceptions::requested_option_not_present::requested_option_not_present
          (requested_option_not_present *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *option_local;
  requested_option_not_present *this_local;
  
  local_18 = option;
  option_local = (string *)this;
  std::operator+(&local_98,"Option ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&local_78,&local_98,local_18);
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_38,&local_58," not present");
  parsing::parsing(&this->super_parsing,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  *(undefined ***)&(this->super_parsing).super_exception =
       &PTR__requested_option_not_present_001a3358;
  return;
}

Assistant:

explicit requested_option_not_present(const std::string& option)
  : parsing("Option " + LQUOTE + option + RQUOTE + " not present")
  {
  }